

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt6CnfSize(word t,int nVars)

{
  int local_18;
  int local_14;
  int nCubes;
  int nVars_local;
  word t_local;
  
  local_18 = 0;
  local_14 = nVars;
  _nCubes = t;
  Abc_Tt6Isop(t,t,nVars,&local_18);
  Abc_Tt6Isop(_nCubes ^ 0xffffffffffffffff,_nCubes ^ 0xffffffffffffffff,local_14,&local_18);
  if (local_18 < 0x41) {
    return local_18;
  }
  __assert_fail("nCubes <= 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                ,0x76f,"int Abc_Tt6CnfSize(word, int)");
}

Assistant:

static inline int Abc_Tt6CnfSize( word t, int nVars )
{
    int nCubes = 0;
    Abc_Tt6Isop(  t,  t, nVars, &nCubes );
    Abc_Tt6Isop( ~t, ~t, nVars, &nCubes );
    assert( nCubes <= 64 );
    return nCubes;
}